

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::ChaiScript_Basic::eval(ChaiScript_Basic *this,AST_Node *t_ast)

{
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  eval_error *t_ee;
  Dispatch_State local_40;
  AST_Node *t_ast_local;
  ChaiScript_Basic *this_local;
  
  t_ast_local = t_ast;
  this_local = this;
  detail::Dispatch_State::Dispatch_State(&local_40,(Dispatch_Engine *)&t_ast[3].location.filename);
  (**(code **)(*in_RDX + 8))(this,in_RDX,&local_40);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const Boxed_Value eval(const AST_Node &t_ast) {
      try {
        return t_ast.eval(chaiscript::detail::Dispatch_State(m_engine));
      } catch (const exception::eval_error &t_ee) {
        throw Boxed_Value(t_ee);
      }
    }